

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O2

void idct8x8_new_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  byte bVar5;
  int iVar6;
  long lVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar18;
  int iVar19;
  undefined1 auVar17 [16];
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar25;
  int iVar26;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar27;
  int iVar28;
  undefined1 auVar29 [16];
  int iVar30;
  uint uVar31;
  int iVar33;
  uint uVar34;
  int iVar35;
  uint uVar36;
  undefined1 auVar32 [16];
  int iVar37;
  uint uVar38;
  int iVar39;
  int iVar41;
  int iVar42;
  undefined1 auVar40 [16];
  int iVar43;
  int iVar44;
  uint uVar45;
  int iVar46;
  uint uVar47;
  int iVar48;
  uint uVar49;
  int iVar50;
  uint uVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  int iVar56;
  int iVar58;
  int iVar59;
  undefined1 auVar57 [16];
  int iVar60;
  int iVar61;
  uint uVar62;
  int iVar65;
  uint uVar66;
  int iVar67;
  uint uVar68;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  int iVar69;
  uint uVar70;
  int iVar71;
  int iVar74;
  int iVar75;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  int iVar76;
  __m128i clamp_hi_out;
  __m128i clamp_lo_out;
  
  lVar7 = (long)bit * 0x100;
  iVar6 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x180);
  iVar8 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1a0);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x240);
  uVar2 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1c0);
  uVar3 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x1e0);
  uVar4 = *(undefined4 *)((long)vert_filter_length_chroma + lVar7 + 0x220);
  iVar21 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x200);
  iVar9 = -iVar6;
  iVar12 = -iVar21;
  iVar10 = 1 << ((char)bit - 1U & 0x1f);
  iVar13 = -iVar8;
  iVar11 = bd + 6 + (uint)(do_cols == 0) * 2;
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  auVar54._4_4_ = iVar9;
  auVar54._0_4_ = iVar9;
  auVar54._8_4_ = iVar9;
  auVar54._12_4_ = iVar9;
  auVar24._4_4_ = uVar2;
  auVar24._0_4_ = uVar2;
  auVar24._8_4_ = uVar2;
  auVar24._12_4_ = uVar2;
  auVar23._4_4_ = iVar12;
  auVar23._0_4_ = iVar12;
  auVar23._8_4_ = iVar12;
  auVar23._12_4_ = iVar12;
  auVar40._4_4_ = iVar21;
  auVar40._0_4_ = iVar21;
  auVar40._8_4_ = iVar21;
  auVar40._12_4_ = iVar21;
  auVar17._4_4_ = iVar6;
  auVar17._0_4_ = iVar6;
  auVar17._8_4_ = iVar6;
  auVar17._12_4_ = iVar6;
  auVar29._4_4_ = uVar3;
  auVar29._0_4_ = uVar3;
  auVar29._8_4_ = uVar3;
  auVar29._12_4_ = uVar3;
  auVar17 = pmulld(auVar17,(undefined1  [16])in[1]);
  auVar32 = pmulld((undefined1  [16])in[1],auVar57);
  auVar54 = pmulld(auVar54,(undefined1  [16])in[7]);
  auVar63 = pmulld((undefined1  [16])in[7],auVar57);
  auVar40 = pmulld(auVar40,(undefined1  [16])in[5]);
  auVar57 = pmulld((undefined1  [16])in[5],auVar24);
  auVar23 = pmulld(auVar23,(undefined1  [16])in[3]);
  auVar72 = pmulld((undefined1  [16])in[3],auVar24);
  auVar24 = pmulld((undefined1  [16])*in,auVar29);
  auVar64 = pmulld((undefined1  [16])in[4],auVar29);
  iVar21 = auVar24._0_4_ + iVar10;
  iVar9 = auVar24._4_4_ + iVar10;
  iVar12 = auVar24._8_4_ + iVar10;
  iVar27 = auVar24._12_4_ + iVar10;
  auVar55._4_4_ = uVar4;
  auVar55._0_4_ = uVar4;
  auVar55._8_4_ = uVar4;
  auVar55._12_4_ = uVar4;
  auVar53._4_4_ = iVar13;
  auVar53._0_4_ = iVar13;
  auVar53._8_4_ = iVar13;
  auVar53._12_4_ = iVar13;
  auVar52._4_4_ = iVar8;
  auVar52._0_4_ = iVar8;
  auVar52._8_4_ = iVar8;
  auVar52._12_4_ = iVar8;
  auVar24 = pmulld(auVar52,(undefined1  [16])in[2]);
  auVar73 = pmulld((undefined1  [16])in[2],auVar55);
  auVar52 = pmulld(auVar53,(undefined1  [16])in[6]);
  auVar53 = ZEXT416((uint)bit);
  iVar6 = 0x8000;
  if (0xf < iVar11) {
    iVar6 = 1 << ((char)iVar11 - 1U & 0x1f);
  }
  iVar8 = -iVar6;
  auVar55 = pmulld((undefined1  [16])in[6],auVar55);
  iVar30 = auVar32._0_4_ + iVar10 + auVar54._0_4_ >> auVar53;
  iVar33 = auVar32._4_4_ + iVar10 + auVar54._4_4_ >> auVar53;
  iVar35 = auVar32._8_4_ + iVar10 + auVar54._8_4_ >> auVar53;
  iVar37 = auVar32._12_4_ + iVar10 + auVar54._12_4_ >> auVar53;
  iVar11 = auVar17._0_4_ + iVar10 + auVar63._0_4_ >> auVar53;
  iVar18 = auVar17._4_4_ + iVar10 + auVar63._4_4_ >> auVar53;
  iVar19 = auVar17._8_4_ + iVar10 + auVar63._8_4_ >> auVar53;
  iVar20 = auVar17._12_4_ + iVar10 + auVar63._12_4_ >> auVar53;
  iVar56 = auVar57._0_4_ + iVar10 + auVar23._0_4_ >> auVar53;
  iVar58 = auVar57._4_4_ + iVar10 + auVar23._4_4_ >> auVar53;
  iVar59 = auVar57._8_4_ + iVar10 + auVar23._8_4_ >> auVar53;
  iVar60 = auVar57._12_4_ + iVar10 + auVar23._12_4_ >> auVar53;
  iVar39 = auVar40._0_4_ + iVar10 + auVar72._0_4_ >> auVar53;
  iVar41 = auVar40._4_4_ + iVar10 + auVar72._4_4_ >> auVar53;
  iVar42 = auVar40._8_4_ + iVar10 + auVar72._8_4_ >> auVar53;
  iVar43 = auVar40._12_4_ + iVar10 + auVar72._12_4_ >> auVar53;
  iVar13 = iVar21 + auVar64._0_4_ >> auVar53;
  iVar14 = iVar9 + auVar64._4_4_ >> auVar53;
  iVar15 = iVar12 + auVar64._8_4_ >> auVar53;
  iVar16 = iVar27 + auVar64._12_4_ >> auVar53;
  iVar22 = iVar21 - auVar64._0_4_ >> auVar53;
  iVar25 = iVar9 - auVar64._4_4_ >> auVar53;
  iVar26 = iVar12 - auVar64._8_4_ >> auVar53;
  iVar28 = iVar27 - auVar64._12_4_ >> auVar53;
  iVar71 = auVar73._0_4_ + iVar10 + auVar52._0_4_ >> auVar53;
  iVar74 = auVar73._4_4_ + iVar10 + auVar52._4_4_ >> auVar53;
  iVar75 = auVar73._8_4_ + iVar10 + auVar52._8_4_ >> auVar53;
  iVar76 = auVar73._12_4_ + iVar10 + auVar52._12_4_ >> auVar53;
  iVar21 = auVar24._0_4_ + iVar10 + auVar55._0_4_ >> auVar53;
  iVar9 = auVar24._4_4_ + iVar10 + auVar55._4_4_ >> auVar53;
  iVar12 = auVar24._8_4_ + iVar10 + auVar55._8_4_ >> auVar53;
  iVar27 = auVar24._12_4_ + iVar10 + auVar55._12_4_ >> auVar53;
  iVar6 = iVar6 + -1;
  iVar44 = iVar56 + iVar30;
  iVar46 = iVar58 + iVar33;
  iVar48 = iVar59 + iVar35;
  iVar50 = iVar60 + iVar37;
  iVar30 = iVar30 - iVar56;
  iVar33 = iVar33 - iVar58;
  iVar35 = iVar35 - iVar59;
  iVar37 = iVar37 - iVar60;
  iVar61 = iVar39 + iVar11;
  iVar65 = iVar41 + iVar18;
  iVar67 = iVar42 + iVar19;
  iVar69 = iVar43 + iVar20;
  iVar11 = iVar11 - iVar39;
  iVar18 = iVar18 - iVar41;
  iVar19 = iVar19 - iVar42;
  iVar20 = iVar20 - iVar43;
  iVar56 = iVar21 + iVar13;
  iVar58 = iVar9 + iVar14;
  iVar59 = iVar12 + iVar15;
  iVar60 = iVar27 + iVar16;
  iVar13 = iVar13 - iVar21;
  iVar14 = iVar14 - iVar9;
  iVar15 = iVar15 - iVar12;
  iVar16 = iVar16 - iVar27;
  iVar39 = iVar71 + iVar22;
  iVar41 = iVar74 + iVar25;
  iVar42 = iVar75 + iVar26;
  iVar43 = iVar76 + iVar28;
  iVar22 = iVar22 - iVar71;
  iVar25 = iVar25 - iVar74;
  iVar26 = iVar26 - iVar75;
  iVar28 = iVar28 - iVar76;
  uVar31 = (uint)(iVar30 < iVar8) * iVar8 | (uint)(iVar30 >= iVar8) * iVar30;
  uVar34 = (uint)(iVar33 < iVar8) * iVar8 | (uint)(iVar33 >= iVar8) * iVar33;
  uVar36 = (uint)(iVar35 < iVar8) * iVar8 | (uint)(iVar35 >= iVar8) * iVar35;
  uVar38 = (uint)(iVar37 < iVar8) * iVar8 | (uint)(iVar37 >= iVar8) * iVar37;
  auVar63._0_4_ = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  auVar63._4_4_ = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  auVar63._8_4_ = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  auVar63._12_4_ = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar34 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar36 = (uint)(iVar19 < iVar8) * iVar8 | (uint)(iVar19 >= iVar8) * iVar19;
  uVar38 = (uint)(iVar20 < iVar8) * iVar8 | (uint)(iVar20 >= iVar8) * iVar20;
  auVar32._0_4_ = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  auVar32._4_4_ = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  auVar32._8_4_ = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  auVar32._12_4_ = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  auVar17 = pmulld(auVar63,auVar29);
  auVar24 = pmulld(auVar32,auVar29);
  uVar31 = (uint)(iVar61 < iVar8) * iVar8 | (uint)(iVar61 >= iVar8) * iVar61;
  uVar34 = (uint)(iVar65 < iVar8) * iVar8 | (uint)(iVar65 >= iVar8) * iVar65;
  uVar36 = (uint)(iVar67 < iVar8) * iVar8 | (uint)(iVar67 >= iVar8) * iVar67;
  uVar38 = (uint)(iVar69 < iVar8) * iVar8 | (uint)(iVar69 >= iVar8) * iVar69;
  uVar62 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar66 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar68 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar70 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar56 < iVar8) * iVar8 | (uint)(iVar56 >= iVar8) * iVar56;
  uVar34 = (uint)(iVar58 < iVar8) * iVar8 | (uint)(iVar58 >= iVar8) * iVar58;
  uVar36 = (uint)(iVar59 < iVar8) * iVar8 | (uint)(iVar59 >= iVar8) * iVar59;
  uVar38 = (uint)(iVar60 < iVar8) * iVar8 | (uint)(iVar60 >= iVar8) * iVar60;
  iVar20 = auVar17._0_4_ + iVar10 + auVar24._0_4_ >> auVar53;
  iVar30 = auVar17._4_4_ + iVar10 + auVar24._4_4_ >> auVar53;
  iVar33 = auVar17._8_4_ + iVar10 + auVar24._8_4_ >> auVar53;
  iVar35 = auVar17._12_4_ + iVar10 + auVar24._12_4_ >> auVar53;
  uVar31 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar34 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  iVar21 = (iVar10 - auVar17._0_4_) + auVar24._0_4_ >> auVar53;
  iVar9 = (iVar10 - auVar17._4_4_) + auVar24._4_4_ >> auVar53;
  iVar11 = (iVar10 - auVar17._8_4_) + auVar24._8_4_ >> auVar53;
  iVar10 = (iVar10 - auVar17._12_4_) + auVar24._12_4_ >> auVar53;
  iVar12 = uVar31 + uVar62;
  iVar27 = uVar34 + uVar66;
  iVar18 = uVar36 + uVar68;
  iVar19 = uVar38 + uVar70;
  iVar37 = uVar31 - uVar62;
  iVar56 = uVar34 - uVar66;
  iVar58 = uVar36 - uVar68;
  iVar59 = uVar38 - uVar70;
  uVar31 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar34 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar36 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar38 = (uint)(iVar19 < iVar8) * iVar8 | (uint)(iVar19 >= iVar8) * iVar19;
  *(uint *)*out = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  *(uint *)((long)*out + 4) = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  *(uint *)(*out + 1) = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  *(uint *)((long)*out + 0xc) =
       (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar39 < iVar8) * iVar8 | (uint)(iVar39 >= iVar8) * iVar39;
  uVar34 = (uint)(iVar41 < iVar8) * iVar8 | (uint)(iVar41 >= iVar8) * iVar41;
  uVar36 = (uint)(iVar42 < iVar8) * iVar8 | (uint)(iVar42 >= iVar8) * iVar42;
  uVar38 = (uint)(iVar43 < iVar8) * iVar8 | (uint)(iVar43 >= iVar8) * iVar43;
  uVar31 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar34 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar62 = (uint)(iVar37 < iVar8) * iVar8 | (uint)(iVar37 >= iVar8) * iVar37;
  uVar66 = (uint)(iVar56 < iVar8) * iVar8 | (uint)(iVar56 >= iVar8) * iVar56;
  uVar68 = (uint)(iVar58 < iVar8) * iVar8 | (uint)(iVar58 >= iVar8) * iVar58;
  uVar70 = (uint)(iVar59 < iVar8) * iVar8 | (uint)(iVar59 >= iVar8) * iVar59;
  *(uint *)out[7] = (uint)(iVar6 < (int)uVar62) * iVar6 | (iVar6 >= (int)uVar62) * uVar62;
  *(uint *)((long)out[7] + 4) =
       (uint)(iVar6 < (int)uVar66) * iVar6 | (iVar6 >= (int)uVar66) * uVar66;
  *(uint *)(out[7] + 1) = (uint)(iVar6 < (int)uVar68) * iVar6 | (iVar6 >= (int)uVar68) * uVar68;
  *(uint *)((long)out[7] + 0xc) =
       (uint)(iVar6 < (int)uVar70) * iVar6 | (iVar6 >= (int)uVar70) * uVar70;
  iVar12 = uVar31 + iVar20;
  iVar27 = uVar34 + iVar30;
  iVar18 = uVar36 + iVar33;
  iVar19 = uVar38 + iVar35;
  iVar20 = uVar31 - iVar20;
  iVar30 = uVar34 - iVar30;
  iVar33 = uVar36 - iVar33;
  iVar35 = uVar38 - iVar35;
  uVar31 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar34 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar36 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar38 = (uint)(iVar19 < iVar8) * iVar8 | (uint)(iVar19 >= iVar8) * iVar19;
  *(uint *)out[1] = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  *(uint *)((long)out[1] + 4) =
       (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  *(uint *)(out[1] + 1) = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[1] + 0xc) =
       (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar22 < iVar8) * iVar8 | (uint)(iVar22 >= iVar8) * iVar22;
  uVar34 = (uint)(iVar25 < iVar8) * iVar8 | (uint)(iVar25 >= iVar8) * iVar25;
  uVar36 = (uint)(iVar26 < iVar8) * iVar8 | (uint)(iVar26 >= iVar8) * iVar26;
  uVar38 = (uint)(iVar28 < iVar8) * iVar8 | (uint)(iVar28 >= iVar8) * iVar28;
  uVar31 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar34 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar62 = (uint)(iVar20 < iVar8) * iVar8 | (uint)(iVar20 >= iVar8) * iVar20;
  uVar66 = (uint)(iVar30 < iVar8) * iVar8 | (uint)(iVar30 >= iVar8) * iVar30;
  uVar68 = (uint)(iVar33 < iVar8) * iVar8 | (uint)(iVar33 >= iVar8) * iVar33;
  uVar70 = (uint)(iVar35 < iVar8) * iVar8 | (uint)(iVar35 >= iVar8) * iVar35;
  *(uint *)out[6] = (uint)(iVar6 < (int)uVar62) * iVar6 | (iVar6 >= (int)uVar62) * uVar62;
  *(uint *)((long)out[6] + 4) =
       (uint)(iVar6 < (int)uVar66) * iVar6 | (iVar6 >= (int)uVar66) * uVar66;
  *(uint *)(out[6] + 1) = (uint)(iVar6 < (int)uVar68) * iVar6 | (iVar6 >= (int)uVar68) * uVar68;
  *(uint *)((long)out[6] + 0xc) =
       (uint)(iVar6 < (int)uVar70) * iVar6 | (iVar6 >= (int)uVar70) * uVar70;
  iVar12 = iVar21 + uVar31;
  iVar27 = iVar9 + uVar34;
  iVar18 = iVar11 + uVar36;
  iVar19 = iVar10 + uVar38;
  iVar21 = uVar31 - iVar21;
  iVar9 = uVar34 - iVar9;
  iVar11 = uVar36 - iVar11;
  iVar10 = uVar38 - iVar10;
  uVar31 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar34 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar36 = (uint)(iVar18 < iVar8) * iVar8 | (uint)(iVar18 >= iVar8) * iVar18;
  uVar38 = (uint)(iVar19 < iVar8) * iVar8 | (uint)(iVar19 >= iVar8) * iVar19;
  *(uint *)out[2] = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  *(uint *)((long)out[2] + 4) =
       (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  *(uint *)(out[2] + 1) = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[2] + 0xc) =
       (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar44 < iVar8) * iVar8 | (uint)(iVar44 >= iVar8) * iVar44;
  uVar34 = (uint)(iVar46 < iVar8) * iVar8 | (uint)(iVar46 >= iVar8) * iVar46;
  uVar36 = (uint)(iVar48 < iVar8) * iVar8 | (uint)(iVar48 >= iVar8) * iVar48;
  uVar38 = (uint)(iVar50 < iVar8) * iVar8 | (uint)(iVar50 >= iVar8) * iVar50;
  uVar45 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar47 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar49 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar51 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar31 = (uint)(iVar13 < iVar8) * iVar8 | (uint)(iVar13 >= iVar8) * iVar13;
  uVar34 = (uint)(iVar14 < iVar8) * iVar8 | (uint)(iVar14 >= iVar8) * iVar14;
  uVar36 = (uint)(iVar15 < iVar8) * iVar8 | (uint)(iVar15 >= iVar8) * iVar15;
  uVar38 = (uint)(iVar16 < iVar8) * iVar8 | (uint)(iVar16 >= iVar8) * iVar16;
  uVar31 = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  uVar34 = (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  uVar36 = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  uVar38 = (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  uVar62 = (uint)(iVar21 < iVar8) * iVar8 | (uint)(iVar21 >= iVar8) * iVar21;
  uVar66 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar68 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar70 = (uint)(iVar10 < iVar8) * iVar8 | (uint)(iVar10 >= iVar8) * iVar10;
  *(uint *)out[5] = (uint)(iVar6 < (int)uVar62) * iVar6 | (iVar6 >= (int)uVar62) * uVar62;
  *(uint *)((long)out[5] + 4) =
       (uint)(iVar6 < (int)uVar66) * iVar6 | (iVar6 >= (int)uVar66) * uVar66;
  *(uint *)(out[5] + 1) = (uint)(iVar6 < (int)uVar68) * iVar6 | (iVar6 >= (int)uVar68) * uVar68;
  *(uint *)((long)out[5] + 0xc) =
       (uint)(iVar6 < (int)uVar70) * iVar6 | (iVar6 >= (int)uVar70) * uVar70;
  iVar21 = uVar31 + uVar45;
  iVar9 = uVar34 + uVar47;
  iVar10 = uVar36 + uVar49;
  iVar11 = uVar38 + uVar51;
  iVar12 = uVar31 - uVar45;
  iVar13 = uVar34 - uVar47;
  iVar27 = uVar36 - uVar49;
  iVar14 = uVar38 - uVar51;
  uVar31 = (uint)(iVar21 < iVar8) * iVar8 | (uint)(iVar21 >= iVar8) * iVar21;
  uVar34 = (uint)(iVar9 < iVar8) * iVar8 | (uint)(iVar9 >= iVar8) * iVar9;
  uVar36 = (uint)(iVar10 < iVar8) * iVar8 | (uint)(iVar10 >= iVar8) * iVar10;
  uVar38 = (uint)(iVar11 < iVar8) * iVar8 | (uint)(iVar11 >= iVar8) * iVar11;
  uVar62 = (uint)(iVar12 < iVar8) * iVar8 | (uint)(iVar12 >= iVar8) * iVar12;
  uVar66 = (uint)(iVar13 < iVar8) * iVar8 | (uint)(iVar13 >= iVar8) * iVar13;
  uVar68 = (uint)(iVar27 < iVar8) * iVar8 | (uint)(iVar27 >= iVar8) * iVar27;
  uVar70 = (uint)(iVar14 < iVar8) * iVar8 | (uint)(iVar14 >= iVar8) * iVar14;
  *(uint *)out[3] = (uint)(iVar6 < (int)uVar31) * iVar6 | (iVar6 >= (int)uVar31) * uVar31;
  *(uint *)((long)out[3] + 4) =
       (uint)(iVar6 < (int)uVar34) * iVar6 | (iVar6 >= (int)uVar34) * uVar34;
  *(uint *)(out[3] + 1) = (uint)(iVar6 < (int)uVar36) * iVar6 | (iVar6 >= (int)uVar36) * uVar36;
  *(uint *)((long)out[3] + 0xc) =
       (uint)(iVar6 < (int)uVar38) * iVar6 | (iVar6 >= (int)uVar38) * uVar38;
  *(uint *)out[4] = (uint)(iVar6 < (int)uVar62) * iVar6 | (iVar6 >= (int)uVar62) * uVar62;
  *(uint *)((long)out[4] + 4) =
       (uint)(iVar6 < (int)uVar66) * iVar6 | (iVar6 >= (int)uVar66) * uVar66;
  *(uint *)(out[4] + 1) = (uint)(iVar6 < (int)uVar68) * iVar6 | (iVar6 >= (int)uVar68) * uVar68;
  *(uint *)((long)out[4] + 0xc) =
       (uint)(iVar6 < (int)uVar70) * iVar6 | (iVar6 >= (int)uVar70) * uVar70;
  if (do_cols == 0) {
    bVar5 = 10;
    if (10 < bd) {
      bVar5 = (byte)bd;
    }
    iVar6 = 0x20 << (bVar5 & 0x1f);
    clamp_lo_out[0]._0_4_ = -iVar6;
    clamp_hi_out[0]._0_4_ = iVar6 + -1;
    clamp_hi_out[0]._4_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._0_4_ = (int)clamp_hi_out[0];
    clamp_hi_out[1]._4_4_ = (int)clamp_hi_out[0];
    clamp_lo_out[0]._4_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._0_4_ = (int)clamp_lo_out[0];
    clamp_lo_out[1]._4_4_ = (int)clamp_lo_out[0];
    round_shift_4x4(out,out_shift);
    round_shift_4x4(out + 4,out_shift);
    highbd_clamp_epi32_sse4_1(out,out,&clamp_lo_out,&clamp_hi_out,8);
  }
  return;
}

Assistant:

static void idct8x8_new_sse4_1(__m128i *in, __m128i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospim8 = _mm_set1_epi32(-cospi[8]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim40 = _mm_set1_epi32(-cospi[40]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospim16 = _mm_set1_epi32(-cospi[16]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i u0, u1, u2, u3, u4, u5, u6, u7;
  __m128i v0, v1, v2, v3, v4, v5, v6, v7;
  __m128i x, y;

  // stage 0
  // stage 1
  // stage 2
  u0 = in[0];
  u1 = in[4];
  u2 = in[2];
  u3 = in[6];

  x = _mm_mullo_epi32(in[1], cospi56);
  y = _mm_mullo_epi32(in[7], cospim8);
  u4 = _mm_add_epi32(x, y);
  u4 = _mm_add_epi32(u4, rnding);
  u4 = _mm_srai_epi32(u4, bit);

  x = _mm_mullo_epi32(in[1], cospi8);
  y = _mm_mullo_epi32(in[7], cospi56);
  u7 = _mm_add_epi32(x, y);
  u7 = _mm_add_epi32(u7, rnding);
  u7 = _mm_srai_epi32(u7, bit);

  x = _mm_mullo_epi32(in[5], cospi24);
  y = _mm_mullo_epi32(in[3], cospim40);
  u5 = _mm_add_epi32(x, y);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  x = _mm_mullo_epi32(in[5], cospi40);
  y = _mm_mullo_epi32(in[3], cospi24);
  u6 = _mm_add_epi32(x, y);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  // stage 3
  x = _mm_mullo_epi32(u0, cospi32);
  y = _mm_mullo_epi32(u1, cospi32);
  v0 = _mm_add_epi32(x, y);
  v0 = _mm_add_epi32(v0, rnding);
  v0 = _mm_srai_epi32(v0, bit);

  v1 = _mm_sub_epi32(x, y);
  v1 = _mm_add_epi32(v1, rnding);
  v1 = _mm_srai_epi32(v1, bit);

  x = _mm_mullo_epi32(u2, cospi48);
  y = _mm_mullo_epi32(u3, cospim16);
  v2 = _mm_add_epi32(x, y);
  v2 = _mm_add_epi32(v2, rnding);
  v2 = _mm_srai_epi32(v2, bit);

  x = _mm_mullo_epi32(u2, cospi16);
  y = _mm_mullo_epi32(u3, cospi48);
  v3 = _mm_add_epi32(x, y);
  v3 = _mm_add_epi32(v3, rnding);
  v3 = _mm_srai_epi32(v3, bit);

  addsub_sse4_1(u4, u5, &v4, &v5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u7, u6, &v7, &v6, &clamp_lo, &clamp_hi);

  // stage 4
  addsub_sse4_1(v0, v3, &u0, &u3, &clamp_lo, &clamp_hi);
  addsub_sse4_1(v1, v2, &u1, &u2, &clamp_lo, &clamp_hi);
  u4 = v4;
  u7 = v7;

  x = _mm_mullo_epi32(v5, cospi32);
  y = _mm_mullo_epi32(v6, cospi32);
  u6 = _mm_add_epi32(y, x);
  u6 = _mm_add_epi32(u6, rnding);
  u6 = _mm_srai_epi32(u6, bit);

  u5 = _mm_sub_epi32(y, x);
  u5 = _mm_add_epi32(u5, rnding);
  u5 = _mm_srai_epi32(u5, bit);

  // stage 5
  addsub_sse4_1(u0, u7, out + 0, out + 7, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u1, u6, out + 1, out + 6, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u2, u5, out + 2, out + 5, &clamp_lo, &clamp_hi);
  addsub_sse4_1(u3, u4, out + 3, out + 4, &clamp_lo, &clamp_hi);

  if (!do_cols) {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    round_shift_4x4(out, out_shift);
    round_shift_4x4(out + 4, out_shift);
    highbd_clamp_epi32_sse4_1(out, out, &clamp_lo_out, &clamp_hi_out, 8);
  }
}